

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_get_delivery_annotations(MESSAGE_HANDLE message,delivery_annotations *annotations)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || annotations == (delivery_annotations *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x244;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_delivery_annotations",0x243,1,
                "Bad arguments: message = %p, annotations = %p",message,annotations);
    }
  }
  else if (message->delivery_annotations == (AMQP_VALUE)0x0) {
    *annotations = (delivery_annotations)0x0;
    iVar3 = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(message->delivery_annotations);
    *annotations = pAVar2;
    iVar3 = 0;
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 0x259;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_delivery_annotations",600,1,"Cannot clone delivery annotations");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_delivery_annotations(MESSAGE_HANDLE message, delivery_annotations* annotations)
{
    int result;

    if ((message == NULL) ||
        (annotations == NULL))
    {
        /* Codes_SRS_MESSAGE_01_039: [ If `message` or `annotations` is NULL, `message_get_delivery_annotations` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, annotations = %p",
            message, annotations);
        result = MU_FAILURE;
    }
    else
    {
        if (message->delivery_annotations == NULL)
        {
            /* Codes_SRS_MESSAGE_01_142: [ If no delivery annotations have been set, `message_get_delivery_annotations` shall set `annotations` to NULL. ]*/
            *annotations = NULL;

            /* Codes_SRS_MESSAGE_01_038: [ On success, `message_get_delivery_annotations` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_037: [ `message_get_delivery_annotations` shall copy the contents of delivery annotations for the message instance identified by `message` into the argument `annotations`. ]*/
            /* Codes_SRS_MESSAGE_01_040: [ Cloning the delivery annotations shall be done by calling `annotations_clone`. ]*/
            *annotations = annotations_clone(message->delivery_annotations);
            if (*annotations == NULL)
            {
                /* Codes_SRS_MESSAGE_01_041: [ If `annotations_clone` fails, `message_get_delivery_annotations` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone delivery annotations");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_038: [ On success, `message_get_delivery_annotations` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}